

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::enterInitializingModeIterativeAsync(Federate *this)

{
  string_view message;
  bool bVar1;
  undefined8 uVar2;
  future<void> *in_RDI;
  type *unaff_retaddr;
  launch in_stack_0000000c;
  handle asyncInfo;
  Modes cmode;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff88;
  memory_order in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Modes *in_stack_ffffffffffffffa8;
  atomic<helics::Federate::Modes> *in_stack_ffffffffffffffb0;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_28;
  Modes local_9;
  
  local_9 = CLI::std::atomic<helics::Federate::Modes>::load
                      ((atomic<helics::Federate::Modes> *)
                       &(in_RDI->super___basic_future<void>)._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,seq_cst);
  if (local_9 == STARTUP) {
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x254b1e);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_ffffffffffffff88);
    bVar1 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                       (Modes)((uint)in_stack_ffffffffffffffa4 >> 0x18),in_stack_ffffffffffffffa0);
    if (bVar1) {
      std::async<helics::Federate::enterInitializingModeIterativeAsync()::__0>
                (in_stack_0000000c,unaff_retaddr);
      gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(&local_28);
      std::future<void>::operator=
                ((future<void> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_RDI);
      std::future<void>::~future((future<void> *)0x254b93);
    }
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x254bb9);
  }
  else if (local_9 != PENDING_ITERATIVE_INIT) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(char *)in_RDI);
    message._M_str = (char *)in_stack_ffffffffffffffb0;
    message._M_len = (size_t)in_stack_ffffffffffffffa8;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               message);
    __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  return;
}

Assistant:

void Federate::enterInitializingModeIterativeAsync()
{
    auto cmode = currentMode.load();
    if (cmode == Modes::STARTUP) {
        auto asyncInfo = asyncCallInfo->lock();
        if (currentMode.compare_exchange_strong(cmode, Modes::PENDING_ITERATIVE_INIT)) {
            asyncInfo->initIterativeFuture = std::async(std::launch::async, [this]() {
                coreObject->enterInitializingMode(fedID, IterationRequest::FORCE_ITERATION);
            });
        }
    } else if (cmode == Modes::PENDING_ITERATIVE_INIT) {
        return;
    } else {
        // everything else is an error
        throw(InvalidFunctionCall(
            "cannot request iterations in initializing mode if already past that mode"));
    }
}